

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RtAudio.cpp
# Opt level: O0

void RtAudio::getCompiledApi(vector<RtAudio::Api,_std::allocator<RtAudio::Api>_> *apis)

{
  allocator<RtAudio::Api> local_29;
  vector<RtAudio::Api,_std::allocator<RtAudio::Api>_> local_28;
  vector<RtAudio::Api,_std::allocator<RtAudio::Api>_> *local_10;
  vector<RtAudio::Api,_std::allocator<RtAudio::Api>_> *apis_local;
  
  local_10 = apis;
  std::allocator<RtAudio::Api>::allocator(&local_29);
  std::vector<RtAudio::Api,std::allocator<RtAudio::Api>>::vector<RtAudio::Api_const*,void>
            ((vector<RtAudio::Api,std::allocator<RtAudio::Api>> *)&local_28,rtaudio_compiled_apis,
             rtaudio_compiled_apis + 2,&local_29);
  std::vector<RtAudio::Api,_std::allocator<RtAudio::Api>_>::operator=(local_10,&local_28);
  std::vector<RtAudio::Api,_std::allocator<RtAudio::Api>_>::~vector(&local_28);
  std::allocator<RtAudio::Api>::~allocator(&local_29);
  return;
}

Assistant:

void RtAudio :: getCompiledApi( std::vector<RtAudio::Api> &apis )
{
  apis = std::vector<RtAudio::Api>(rtaudio_compiled_apis,
                                   rtaudio_compiled_apis + rtaudio_num_compiled_apis);
}